

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,Context *context,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,char *shaderOp,ShaderDataSpec *spec)

{
  vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_> *this_00;
  Vector<float,_4> *pVVar1;
  float fVar2;
  float fVar3;
  Precision PVar4;
  DataType DVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  ShaderValue *pSVar11;
  char *__s;
  ostringstream *poVar12;
  ostringstream *poVar13;
  float *pfVar14;
  int precision;
  int precision_00;
  char *pcVar15;
  Precision precision_01;
  undefined7 in_register_00000081;
  string *psVar16;
  float *pfVar17;
  int row;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 *puVar23;
  bool bVar24;
  bool bVar25;
  undefined4 uVar26;
  float fVar27;
  ostringstream *local_3f8;
  float local_3ec;
  float local_3e8 [4];
  ulong local_3d8;
  char *local_3d0;
  ShaderOperatorCase *local_3c8;
  ulong local_3c0;
  Mat4 attribMatrix;
  string prefix;
  char *inputPrecision [3];
  ostringstream vtx;
  ostringstream frag;
  
  local_3c0 = CONCAT71(in_register_00000081,isVertexCase) & 0xffffffff;
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_021710c0;
  deqp::gls::ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,context->m_testCtx,context->m_renderCtx,
             context->m_contextInfo,caseName,description,SUB81(local_3c0,0),
             &(this->m_evaluator).super_ShaderEvaluator);
  (this->super_ShaderRenderCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_021710c0;
  local_3f8 = (ostringstream *)CONCAT44(local_3f8._4_4_,spec->resultScale);
  local_3ec = spec->resultBias;
  local_3c8 = this;
  deqp::gls::ShaderEvaluator::ShaderEvaluator(&(this->m_evaluator).super_ShaderEvaluator);
  (this->m_evaluator).super_ShaderEvaluator._vptr_ShaderEvaluator =
       (_func_int **)&PTR__ShaderEvaluator_02171480;
  (this->m_evaluator).m_evalFunc = evalFunc;
  (this->m_evaluator).m_scale = local_3f8._0_4_;
  (this->m_evaluator).m_bias = local_3ec;
  if (spec->precision == PRECISION_LAST) {
    local_3d0 = (char *)0x0;
  }
  else {
    local_3d0 = glu::getPrecisionName(spec->precision);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  local_3f8 = (ostringstream *)&frag;
  if ((char)local_3c0 != '\0') {
    local_3f8 = (ostringstream *)&vtx;
  }
  if (0 < spec->numInputs) {
    pSVar11 = spec->inputs;
    lVar22 = 0;
    do {
      PVar4 = spec->precision;
      precision_01 = PVar4;
      if (PVar4 == PRECISION_LOWP) {
        precision_01 = PRECISION_MEDIUMP;
      }
      if (3 < pSVar11->type - TYPE_INT) {
        precision_01 = PVar4;
      }
      if (pSVar11->type - TYPE_BOOL < 4) {
        precision_01 = PRECISION_MEDIUMP;
      }
      pcVar8 = glu::getPrecisionName(precision_01);
      inputPrecision[lVar22] = pcVar8;
      lVar22 = lVar22 + 1;
      pSVar11 = pSVar11 + 1;
    } while (lVar22 < spec->numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
             "attribute highp vec4 a_position;\n",0x21);
  if (0 < spec->numInputs) {
    lVar22 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"attribute ",10);
      pcVar8 = inputPrecision[lVar22];
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)&local_3f8 +
                        (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                             _vptr_basic_ostream[-3] + 0xd8);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (&vtx.super_basic_ostream<char,_std::char_traits<char>_>," vec4 a_in",10);
      poVar10 = (ostream *)std::ostream::operator<<(&vtx,(int)lVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
      lVar22 = lVar22 + 1;
    } while (lVar22 < spec->numInputs);
  }
  if ((char)local_3c0 == '\0') {
    if (0 < spec->numInputs) {
      lVar22 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"varying ",8);
        pcVar8 = inputPrecision[lVar22];
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)&local_3f8 +
                          (int)vtx.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3] + 0xd8);
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&vtx.super_basic_ostream<char,_std::char_traits<char>_>," vec4 v_in",10);
        poVar10 = (ostream *)std::ostream::operator<<(&vtx,(int)lVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"varying ",8);
        if (pcVar8 == (char *)0x0) {
          std::ios::clear((int)&local_3f8 +
                          (int)frag.super_basic_ostream<char,_std::char_traits<char>_>.
                               _vptr_basic_ostream[-3] + 0x250);
        }
        else {
          sVar9 = strlen(pcVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (&frag.super_basic_ostream<char,_std::char_traits<char>_>," vec4 v_in",10);
        poVar10 = (ostream *)std::ostream::operator<<(&frag,(int)lVar22);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        lVar22 = lVar22 + 1;
      } while (lVar22 < spec->numInputs);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,
               "varying mediump vec4 v_color;\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              (&frag.super_basic_ostream<char,_std::char_traits<char>_>,
               "varying mediump vec4 v_color;\n",0x1e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tgl_Position = a_position;\n"
             ,0x1b);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"{\n",2);
  pcVar8 = "v_";
  if ((char)local_3c0 != '\0') {
    pcVar8 = "a_";
  }
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  pcVar15 = "";
  if ((char)local_3c0 != '\0') {
    pcVar15 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&prefix,pcVar8,pcVar15);
  if (0 < spec->numInputs) {
    pSVar11 = spec->inputs;
    puVar23 = s_inSwizzles;
    lVar22 = 0;
    do {
      DVar5 = pSVar11->type;
      uVar6 = glu::getDataTypeScalarSize(DVar5);
      __s = glu::getDataTypeName(DVar5);
      pcVar8 = *(char **)(puVar23 + (long)(int)(uVar6 - 1) * 8);
      local_3d8 = (ulong)uVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"\t",1);
      pcVar15 = local_3d0;
      local_3ec = (float)(DVar5 - TYPE_BOOL);
      if (local_3d0 != (char *)0x0 && 3 < (uint)local_3ec) {
        sVar9 = strlen(local_3d0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,pcVar15,sVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," ",1);
      }
      if (__s == (char *)0x0) {
        std::ios::clear((int)local_3f8 + (int)*(undefined8 *)(*(long *)local_3f8 + -0x18));
      }
      else {
        sVar9 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,__s,sVar9);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8," in",3);
      poVar10 = (ostream *)std::ostream::operator<<(local_3f8,(int)lVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10," = ",3);
      if ((uint)local_3ec < 4) {
        pcVar15 = "greaterThan(";
        if ((float)local_3d8 == 1.4013e-45) {
          pcVar15 = "(";
        }
        lVar21 = 0xc;
        if ((float)local_3d8 == 1.4013e-45) {
          lVar21 = 1;
        }
LAB_00f20225:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,pcVar15,lVar21);
      }
      else if (DVar5 - TYPE_INT < 4) {
        if (__s == (char *)0x0) {
          lVar21 = 1;
          std::ios::clear((int)local_3f8 + (int)*(undefined8 *)(*(long *)local_3f8 + -0x18));
          pcVar15 = "(";
        }
        else {
          sVar9 = strlen(__s);
          lVar21 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,__s,sVar9);
          pcVar15 = "(";
        }
        goto LAB_00f20225;
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_3f8,prefix._M_dataplus._M_p,prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"in",2);
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,(int)lVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      if (pcVar8 == (char *)0x0) {
        std::ios::clear((int)poVar10 + (int)poVar10->_vptr_basic_ostream[-3]);
      }
      else {
        sVar9 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,sVar9);
      }
      poVar12 = local_3f8;
      if ((uint)local_3ec < 4) {
        lVar21 = 7;
        pcVar8 = " > 0.0)";
        if ((float)local_3d8 != 1.4013e-45) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,", vec",5);
          poVar12 = (ostringstream *)std::ostream::operator<<(local_3f8,(int)local_3d8);
          lVar21 = 6;
          pcVar8 = "(0.0))";
        }
LAB_00f20322:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar8,lVar21);
      }
      else {
        lVar21 = 1;
        pcVar8 = ")";
        if (DVar5 - TYPE_INT < 4) goto LAB_00f20322;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,";\n",2);
      lVar22 = lVar22 + 1;
      pSVar11 = pSVar11 + 1;
      puVar23 = puVar23 + 0x20;
    } while (lVar22 < spec->numInputs);
  }
  pcVar15 = glu::getDataTypeName(spec->output);
  poVar12 = local_3f8;
  DVar5 = spec->output;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3f8,"\t",1);
  pcVar8 = local_3d0;
  if ((local_3d0 != (char *)0x0) && (3 < DVar5 - TYPE_BOOL)) {
    sVar9 = strlen(local_3d0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar8,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," ",1);
  }
  iVar7 = (int)poVar12;
  if (pcVar15 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar9 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar15,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," res = ",7);
  if (pcVar15 == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar9 = strlen(pcVar15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar15,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"(0.0);\n\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\t",1);
  if (shaderOp == (char *)0x0) {
    std::ios::clear(iVar7 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
  }
  else {
    sVar9 = strlen(shaderOp);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,shaderOp,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\n\n",2);
  DVar5 = spec->output;
  iVar7 = glu::getDataTypeScalarSize(DVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar12,"\tmediump vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n",0x30);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\tcolor.",7);
  pcVar8 = *(char **)(s_outSwizzles + (long)(iVar7 + -1) * 8);
  sVar9 = strlen(pcVar8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,pcVar8,sVar9);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," = ",3);
  bVar24 = 3 < DVar5 - TYPE_FLOAT;
  bVar25 = iVar7 != 1;
  pcVar8 = "float(res)";
  if (bVar25 || !bVar24) {
    pcVar8 = "res";
  }
  lVar22 = 10;
  if (bVar25 || !bVar24) {
    lVar22 = 3;
  }
  poVar13 = poVar12;
  if (bVar25 && bVar24) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"vec",3);
    poVar13 = (ostringstream *)std::ostream::operator<<(poVar12,iVar7);
    lVar22 = 5;
    pcVar8 = "(res)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar13,pcVar8,lVar22);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,";\n",2);
  fVar2 = spec->resultScale;
  local_3ec = spec->resultBias;
  local_3d8 = CONCAT44(local_3d8._4_4_,fVar2);
  if ((((fVar2 != 1.0) || (NAN(fVar2))) || (local_3ec != 0.0)) || (NAN(local_3ec))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,"\tcolor = color",0xe);
    if (((float)local_3d8 != 1.0) || (NAN((float)local_3d8))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," * ",3);
      de::floatToString_abi_cxx11_((string *)&attribMatrix,(de *)0x2,(float)local_3d8,precision);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar12,(char *)attribMatrix.m_data.m_data[0].m_data._0_8_,
                 attribMatrix.m_data.m_data[0].m_data._8_8_);
      if ((Vector<float,_4> *)attribMatrix.m_data.m_data[0].m_data._0_8_ !=
          attribMatrix.m_data.m_data + 1) {
        operator_delete((void *)attribMatrix.m_data.m_data[0].m_data._0_8_,
                        attribMatrix.m_data.m_data[1].m_data._0_8_ + 1);
      }
    }
    if ((local_3ec != 0.0) || (NAN(local_3ec))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12," + ",3);
      de::floatToString_abi_cxx11_((string *)&attribMatrix,(de *)0x2,local_3ec,precision_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar12,(char *)attribMatrix.m_data.m_data[0].m_data._0_8_,
                 attribMatrix.m_data.m_data[0].m_data._8_8_);
      if ((Vector<float,_4> *)attribMatrix.m_data.m_data[0].m_data._0_8_ !=
          attribMatrix.m_data.m_data + 1) {
        operator_delete((void *)attribMatrix.m_data.m_data[0].m_data._0_8_,
                        attribMatrix.m_data.m_data[1].m_data._0_8_ + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar12,";\n",2);
  }
  if ((char)local_3c0 == '\0') {
    lVar22 = 0x17;
    pcVar8 = "\tgl_FragColor = color;\n";
    if (0 < spec->numInputs) {
      iVar7 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_in",5);
        poVar10 = (ostream *)std::ostream::operator<<(&vtx,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10," = a_in",7);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,";\n",2);
        iVar7 = iVar7 + 1;
      } while (iVar7 < spec->numInputs);
      lVar22 = 0x17;
      pcVar8 = "\tgl_FragColor = color;\n";
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_color = color;\n",0x12);
    lVar22 = 0x19;
    pcVar8 = "\tgl_FragColor = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8,lVar22);
  std::__ostream_insert<char,std::char_traits<char>>
            (&vtx.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(local_3c8->super_ShaderRenderCase).m_vertShaderSource,
             (string *)&attribMatrix);
  pVVar1 = attribMatrix.m_data.m_data + 1;
  if ((Vector<float,_4> *)attribMatrix.m_data.m_data[0].m_data._0_8_ != pVVar1) {
    operator_delete((void *)attribMatrix.m_data.m_data[0].m_data._0_8_,
                    attribMatrix.m_data.m_data[1].m_data._0_8_ + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(local_3c8->super_ShaderRenderCase).m_fragShaderSource,
             (string *)&attribMatrix);
  if ((Vector<float,_4> *)attribMatrix.m_data.m_data[0].m_data._0_8_ != pVVar1) {
    operator_delete((void *)attribMatrix.m_data.m_data[0].m_data._0_8_,
                    attribMatrix.m_data.m_data[1].m_data._0_8_ + 1);
  }
  this_00 = &(local_3c8->super_ShaderRenderCase).m_userAttribTransforms;
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::resize
            (this_00,(long)spec->numInputs);
  iVar7 = spec->numInputs;
  if (0 < (long)iVar7) {
    pfVar14 = (float *)(this_00->
                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
    lVar22 = 0;
    do {
      fVar2 = spec->inputs[lVar22].rangeMin;
      fVar3 = spec->inputs[lVar22].rangeMax;
      attribMatrix.m_data.m_data[3].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[3].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[2].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[1].m_data[3] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[0] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[1] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[2] = 0.0;
      attribMatrix.m_data.m_data[0].m_data[3] = 0.0;
      lVar21 = 0;
      lVar19 = 0;
      psVar16 = (string *)&attribMatrix;
      do {
        lVar20 = 0;
        do {
          uVar26 = 0x3f800000;
          if (lVar21 != lVar20) {
            uVar26 = 0;
          }
          *(undefined4 *)(psVar16 + lVar20) = uVar26;
          lVar20 = lVar20 + 0x10;
        } while (lVar20 != 0x40);
        lVar19 = lVar19 + 1;
        psVar16 = psVar16 + 4;
        lVar21 = lVar21 + 0x10;
      } while (lVar19 != 4);
      fVar27 = fVar3 - fVar2;
      lVar21 = 0;
      psVar16 = (string *)&attribMatrix;
      do {
        uVar18 = (int)lVar21 + (int)lVar22;
        uVar6 = (int)lVar21 + 3 + (int)lVar22;
        if (-1 < (int)uVar18) {
          uVar6 = uVar18;
        }
        local_3e8[0] = 0.0;
        local_3e8[1] = 0.0;
        local_3e8[2] = 0.0;
        local_3e8[3] = 0.0;
        switch(uVar18 - (uVar6 & 0xfffffffc)) {
        case 0:
          local_3e8[0] = fVar27;
          local_3e8[1] = 0.0;
          local_3e8[2] = 0.0;
          break;
        case 1:
          local_3e8[0] = 0.0;
          local_3e8[1] = fVar27;
          local_3e8[2] = 0.0;
          break;
        case 2:
          local_3e8[0] = -fVar27;
          local_3e8[1] = 0.0;
          local_3e8[2] = 0.0;
          goto LAB_00f209bf;
        case 3:
          local_3e8[0] = 0.0;
          local_3e8[1] = -fVar27;
          local_3e8[2] = 0.0;
LAB_00f209bf:
          local_3e8[3] = fVar3;
        default:
          goto switchD_00f2098c_default;
        }
        local_3e8[3] = fVar2;
switchD_00f2098c_default:
        local_3e8[2] = 0.0;
        lVar19 = 0;
        do {
          *(undefined4 *)(psVar16 + lVar19 * 4) = *(undefined4 *)((long)local_3e8 + lVar19);
          lVar19 = lVar19 + 4;
        } while (lVar19 != 0x10);
        lVar21 = lVar21 + 1;
        psVar16 = psVar16 + 4;
      } while (lVar21 != 4);
      lVar21 = 0;
      psVar16 = (string *)&attribMatrix;
      pfVar17 = pfVar14;
      do {
        lVar19 = 0;
        do {
          *(undefined4 *)((long)pfVar17 + lVar19) = *(undefined4 *)(psVar16 + lVar19);
          lVar19 = lVar19 + 0x10;
        } while (lVar19 != 0x40);
        lVar21 = lVar21 + 1;
        pfVar17 = pfVar17 + 1;
        psVar16 = psVar16 + 4;
      } while (lVar21 != 4);
      lVar22 = lVar22 + 1;
      pfVar14 = pfVar14 + 0x10;
    } while (lVar22 != iVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)prefix._M_dataplus._M_p != &prefix.field_2) {
    operator_delete(prefix._M_dataplus._M_p,prefix.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::ios_base::~ios_base
            ((ios_base *)&frag.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  std::ios_base::~ios_base
            ((ios_base *)&vtx.super_basic_ostream<char,_std::char_traits<char>_>.field_0x70);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (Context& context, const char* caseName, const char* description, bool isVertexCase, ShaderEvalFunc evalFunc, const char* shaderOp, const ShaderDataSpec& spec)
	: ShaderRenderCase(context.getTestContext(), context.getRenderContext(), context.getContextInfo(), caseName, description, isVertexCase, m_evaluator)
	, m_evaluator(evalFunc, spec.resultScale, spec.resultBias)
{
	const char*		precision	= spec.precision != PRECISION_LAST ? getPrecisionName(spec.precision) : DE_NULL;
	const char*		inputPrecision[MAX_INPUTS];

	ostringstream	vtx;
	ostringstream	frag;
	ostringstream&	op			= isVertexCase ? vtx : frag;

	// Compute precision for inputs.
	for (int i = 0; i < spec.numInputs; i++)
	{
		bool		isBoolVal	= de::inRange<int>(spec.inputs[i].type, TYPE_BOOL, TYPE_BOOL_VEC4);
		bool		isIntVal	= de::inRange<int>(spec.inputs[i].type, TYPE_INT, TYPE_INT_VEC4);
		// \note Mediump interpolators are used for booleans and lowp ints.
		Precision	prec		= isBoolVal || (isIntVal && spec.precision == PRECISION_LOWP) ? PRECISION_MEDIUMP : spec.precision;
		inputPrecision[i] = getPrecisionName(prec);
	}

	// Attributes.
	vtx << "attribute highp vec4 a_position;\n";
	for (int i = 0; i < spec.numInputs; i++)
		vtx << "attribute " << inputPrecision[i] << " vec4 a_in" << i << ";\n";

	if (isVertexCase)
	{
		vtx << "varying mediump vec4 v_color;\n";
		frag << "varying mediump vec4 v_color;\n";
	}
	else
	{
		for (int i = 0; i < spec.numInputs; i++)
		{
			vtx << "varying " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
			frag << "varying " << inputPrecision[i] << " vec4 v_in" << i << ";\n";
		}
	}

	vtx << "\n";
	vtx << "void main()\n";
	vtx << "{\n";
	vtx << "	gl_Position = a_position;\n";

	frag << "\n";
	frag << "void main()\n";
	frag << "{\n";

	// Expression inputs.
	string prefix = isVertexCase ? "a_" : "v_";
	for (int i = 0; i < spec.numInputs; i++)
	{
		DataType		inType		= spec.inputs[i].type;
		int				inSize		= getDataTypeScalarSize(inType);
		bool			isInt		= de::inRange<int>(inType, TYPE_INT, TYPE_INT_VEC4);
		bool			isBool		= de::inRange<int>(inType, TYPE_BOOL, TYPE_BOOL_VEC4);
		const char*		typeName	= getDataTypeName(inType);
		const char*		swizzle		= s_inSwizzles[i][inSize-1];

		op << "\t";
		if (precision && !isBool) op << precision << " ";

		op << typeName << " in" << i << " = ";

		if (isBool)
		{
			if (inSize == 1)	op << "(";
			else				op << "greaterThan(";
		}
		else if (isInt)
			op << typeName << "(";

		op << prefix << "in" << i << "." << swizzle;

		if (isBool)
		{
			if (inSize == 1)	op << " > 0.0)";
			else				op << ", vec" << inSize << "(0.0))";
		}
		else if (isInt)
			op << ")";

		op << ";\n";
	}

	// Result variable.
	{
		const char* outTypeName = getDataTypeName(spec.output);
		bool		isBoolOut	= de::inRange<int>(spec.output, TYPE_BOOL, TYPE_BOOL_VEC4);

		op << "\t";
		if (precision && !isBoolOut) op << precision << " ";
		op << outTypeName << " res = " << outTypeName << "(0.0);\n\n";
	}

	// Expression.
	op << "\t" << shaderOp << "\n\n";

	// Convert to color.
	bool	isResFloatVec	= de::inRange<int>(spec.output, TYPE_FLOAT, TYPE_FLOAT_VEC4);
	int		outScalarSize	= getDataTypeScalarSize(spec.output);

	op << "\tmediump vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n";
	op << "\tcolor." << s_outSwizzles[outScalarSize-1] << " = ";

	if (!isResFloatVec && outScalarSize == 1)
		op << "float(res)";
	else if (!isResFloatVec)
		op << "vec" << outScalarSize << "(res)";
	else
		op << "res";

	op << ";\n";

	// Scale & bias.
	float	resultScale		= spec.resultScale;
	float	resultBias		= spec.resultBias;
	if ((resultScale != 1.0f) || (resultBias != 0.0f))
	{
		op << "\tcolor = color";
		if (resultScale != 1.0f) op << " * " << de::floatToString(resultScale, 2);
		if (resultBias != 0.0f)  op << " + " << de::floatToString(resultBias, 2);
		op << ";\n";
	}

	// ..
	if (isVertexCase)
	{
		vtx << "	v_color = color;\n";
		frag << "	gl_FragColor = v_color;\n";
	}
	else
	{
		for (int i = 0; i < spec.numInputs; i++)
		vtx << "	v_in" << i << " = a_in" << i << ";\n";
		frag << "	gl_FragColor = color;\n";
	}

	vtx << "}\n";
	frag << "}\n";

	m_vertShaderSource = vtx.str();
	m_fragShaderSource = frag.str();

	// Setup the user attributes.
	m_userAttribTransforms.resize(spec.numInputs);
	for (int inputNdx = 0; inputNdx < spec.numInputs; inputNdx++)
	{
		const ShaderValue& v = spec.inputs[inputNdx];
		DE_ASSERT(v.type != TYPE_LAST);

		float scale		= (v.rangeMax - v.rangeMin);
		float minBias	= v.rangeMin;
		float maxBias	= v.rangeMax;
		Mat4  attribMatrix;

		for (int rowNdx = 0; rowNdx < 4; rowNdx++)
		{
			Vec4 row;

			switch ((rowNdx + inputNdx) % 4)
			{
				case 0:	row = Vec4(scale, 0.0f, 0.0f, minBias);		break;
				case 1:	row = Vec4(0.0f, scale, 0.0f, minBias);		break;
				case 2:	row = Vec4(-scale, 0.0f, 0.0f, maxBias);	break;
				case 3:	row = Vec4(0.0f, -scale, 0.0f, maxBias);	break;
				default: DE_ASSERT(false);
			}

			attribMatrix.setRow(rowNdx, row);
		}

		m_userAttribTransforms[inputNdx] = attribMatrix;
	}
}